

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

bool __thiscall FileInfoCacheKey::isRelativePath(FileInfoCacheKey *this,QString *file)

{
  char16_t cVar1;
  int iVar2;
  char16_t *pcVar3;
  bool bVar4;
  bool bVar5;
  
  iVar2 = (int)(file->d).size;
  if (iVar2 != 0) {
    pcVar3 = (file->d).ptr;
    cVar1 = *pcVar3;
    if (iVar2 < 2) {
      bVar5 = false;
    }
    else {
      bVar5 = pcVar3[1] == L':';
    }
    bVar4 = false;
    if ((cVar1 != L'/') && (cVar1 != L'\\')) {
      bVar4 = QChar::isLetter((uint)(ushort)cVar1);
      bVar4 = (bool)(bVar4 & bVar5 ^ 1);
    }
    return bVar4;
  }
  return true;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }